

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reportjson.cpp
# Opt level: O2

void __thiscall
trun::ResultsReportJSON::PrintFailures
          (ResultsReportJSON *this,
          vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
          *results)

{
  __shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  shared_ptr<trun::TestResult> r;
  __shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  if ((this->bHadSuccess != false) || (this->bHadSummary == true)) {
    fwrite(",\n",2,1,(FILE *)(this->super_ResultsReportPinterBase).fout);
  }
  bVar3 = false;
  ResultsReportPinterBase::WriteLine(&this->super_ResultsReportPinterBase,"\"Failures\":[");
  ResultsReportPinterBase::PushIndent(&this->super_ResultsReportPinterBase);
  p_Var1 = &((results->
             super__Vector_base<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
             )._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>;
  for (p_Var2 = &((results->
                  super__Vector_base<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
                  )._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>; p_Var2 != p_Var1;
      p_Var2 = p_Var2 + 1) {
    std::__shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&r.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>,p_Var2);
    if ((r.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->testResult !=
        kTestResult_Pass) {
      if (bVar3) {
        ResultsReportPinterBase::WriteNoIndent(&this->super_ResultsReportPinterBase,",\n");
      }
      std::__shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,&r.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>);
      PrintTestResult(this,(Ref *)&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      bVar3 = true;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&r.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  ResultsReportPinterBase::PopIndent(&this->super_ResultsReportPinterBase);
  ResultsReportPinterBase::WriteLine(&this->super_ResultsReportPinterBase,"");
  ResultsReportPinterBase::Write(&this->super_ResultsReportPinterBase,"]");
  this->bHadFailures = true;
  return;
}

Assistant:

void ResultsReportJSON::PrintFailures(const std::vector<TestResult::Ref > &results) {
    if (bHadSuccess || bHadSummary) {
        fprintf(fout,",\n");
    }

    WriteLine("\"Failures\":[");
    PushIndent();
    bool bNeedComma = false;

    for (auto r : results) {
        if (r->Result() != kTestResult_Pass) {
            if (bNeedComma) {
                WriteNoIndent(",\n");
            }
            PrintTestResult(r);
            bNeedComma = true;
        }
    }
    PopIndent();
    WriteLine("");
    Write("]");
    bHadFailures = true;
}